

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainstate.cpp
# Opt level: O1

ChainstateLoadResult *
node::CompleteChainstateInitialization
          (ChainstateLoadResult *__return_storage_ptr__,ChainstateManager *chainman,
          CacheSizes *cache_sizes,ChainstateLoadOptions *options)

{
  unique_ptr<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_> *this;
  BlockManager *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool should_wipe;
  CoinsViews *pCVar3;
  pointer ppCVar4;
  double dVar5;
  path leveldb_name;
  bool bVar6;
  CDBWrapper *this_01;
  CBlockIndex *pCVar7;
  Chainstate *pCVar8;
  ulong uVar9;
  unique_ptr<CoinsViews,_std::default_delete<CoinsViews>_> *puVar10;
  CCoinsViewCache *pCVar11;
  uchar *puVar12;
  ChainstateManager *this_02;
  pointer __p;
  _Alloc_hider _Var13;
  pointer ppCVar14;
  long lVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar16;
  pointer ppCVar17;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  vector<Chainstate_*,_std::allocator<Chainstate_*>_> chainstates;
  bilingual_str *__return_storage_ptr___00;
  char *in_stack_fffffffffffffe70;
  ChainstateManager *pCVar18;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> __x;
  vector<Chainstate_*,_std::allocator<Chainstate_*>_> local_168;
  _Any_data local_150;
  code *local_140;
  bilingual_str local_130;
  path local_f0;
  bilingual_str local_c8;
  path local_88;
  path local_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this = &(chainman->m_blockman).m_block_tree_db;
  std::__uniq_ptr_impl<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_>::reset
            ((__uniq_ptr_impl<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_> *)this
             ,(pointer)0x0);
  std::filesystem::__cxx11::path::path(&local_88,&(chainman->m_options).datadir.super_path);
  std::filesystem::__cxx11::path::_M_append(&local_88,6,"blocks");
  std::filesystem::__cxx11::path::path(&local_60,&local_88);
  std::filesystem::__cxx11::path::_M_append(&local_60,5,"index");
  std::filesystem::__cxx11::path::path((path *)&local_c8,&local_60);
  local_c8.translated._M_string_length = cache_sizes->block_tree_db;
  local_c8.translated.field_2._M_local_buf[0] = options->block_tree_db_in_memory;
  local_c8.translated.field_2._M_local_buf[1] = options->wipe_block_tree_db;
  local_c8.translated.field_2._M_local_buf[2] = '\0';
  local_c8.translated.field_2._M_local_buf[3] = (chainman->m_options).block_tree_db.force_compact;
  this_01 = (CDBWrapper *)operator_new(0x70);
  CDBWrapper::CDBWrapper(this_01,(DBParams *)&local_c8);
  this_00 = &chainman->m_blockman;
  local_130.original._M_dataplus._M_p = (char *)0x0;
  std::__uniq_ptr_impl<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_>::reset
            ((__uniq_ptr_impl<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_> *)this
             ,(pointer)this_01);
  this_02 = chainman;
  std::unique_ptr<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_>::~unique_ptr
            ((unique_ptr<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_> *)
             &local_130);
  std::filesystem::__cxx11::path::~path((path *)&local_c8);
  std::filesystem::__cxx11::path::~path(&local_60);
  std::filesystem::__cxx11::path::~path(&local_88);
  if (options->wipe_block_tree_db == true) {
    kernel::BlockTreeDB::WriteReindexing
              ((chainman->m_blockman).m_block_tree_db._M_t.
               super___uniq_ptr_impl<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_>
               ._M_t.
               super__Tuple_impl<0UL,_kernel::BlockTreeDB_*,_std::default_delete<kernel::BlockTreeDB>_>
               .super__Head_base<0UL,_kernel::BlockTreeDB_*,_false>._M_head_impl,true);
    LOCK();
    (chainman->m_blockman).m_blockfiles_indexed._M_base._M_i = false;
    UNLOCK();
    if (options->prune == true) {
      BlockManager::CleanupBlockRevFiles(this_00);
    }
  }
  bVar6 = util::SignalInterrupt::operator_cast_to_bool(chainman->m_interrupt);
  pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __return_storage_ptr__;
  if (bVar6) {
    local_c8.original._M_dataplus._M_p = (pointer)&local_c8.original.field_2;
    local_c8.original._M_string_length = 0;
    local_c8.original.field_2._M_local_buf[0] = '\0';
    local_c8.translated._M_dataplus._M_p = (pointer)&local_c8.translated.field_2;
    local_c8.translated._M_string_length = 0;
    local_c8.translated.field_2._M_local_buf[0] = '\0';
    std::_Head_base<1UL,_bilingual_str,_false>::_Head_base
              ((_Head_base<1UL,_bilingual_str,_false> *)__return_storage_ptr__,&local_c8);
LAB_002253be:
    *(ChainstateLoadStatus *)
     &(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)__return_storage_ptr__ + 0x40))->_M_dataplus)._M_p = INTERRUPTED;
LAB_002253c6:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.translated._M_dataplus._M_p != &local_c8.translated.field_2) {
      operator_delete(local_c8.translated._M_dataplus._M_p,
                      CONCAT44(local_c8.translated.field_2._M_allocated_capacity._4_4_,
                               CONCAT13(local_c8.translated.field_2._M_local_buf[3],
                                        CONCAT12(local_c8.translated.field_2._M_local_buf[2],
                                                 CONCAT11(local_c8.translated.field_2._M_local_buf
                                                          [1],local_c8.translated.field_2.
                                                              _M_local_buf[0])))) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.original._M_dataplus._M_p != &local_c8.original.field_2) {
      operator_delete(local_c8.original._M_dataplus._M_p,
                      CONCAT71(local_c8.original.field_2._M_allocated_capacity._1_7_,
                               local_c8.original.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    bVar6 = ChainstateManager::LoadBlockIndex(chainman);
    if (bVar6) {
      if (((chainman->m_blockman).m_block_index._M_h._M_element_count == 0) ||
         (pCVar7 = BlockManager::LookupBlockIndex
                             (this_00,(uint256 *)(chainman->m_options).chainparams),
         pCVar7 != (CBlockIndex *)0x0)) {
        if (((chainman->m_blockman).m_have_pruned == true) && (options->prune == false)) {
          local_c8.original._M_dataplus._M_p = (pointer)&local_c8.original.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_c8,
                     "You need to rebuild the database using -reindex to go back to unpruned mode.  This will redownload the entire blockchain"
                     ,"");
          if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
            local_c8.translated._M_dataplus._M_p = (pointer)&local_c8.translated.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_c8.translated,
                       "You need to rebuild the database using -reindex to go back to unpruned mode.  This will redownload the entire blockchain"
                       ,"");
          }
          else {
            local_130.original._M_dataplus._M_p =
                 "You need to rebuild the database using -reindex to go back to unpruned mode.  This will redownload the entire blockchain"
            ;
            (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                      (&local_c8.translated,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,
                       (char **)&local_130);
          }
LAB_00225cd8:
          (((_Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str> *)&pbVar16->_M_dataplus)->
          super__Tuple_impl<1UL,_bilingual_str>).super__Head_base<1UL,_bilingual_str,_false>.
          _M_head_impl.original._M_dataplus._M_p = (pointer)&pbVar16->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8.original._M_dataplus._M_p == &local_c8.original.field_2) {
            (pbVar16->field_2)._M_allocated_capacity =
                 CONCAT71(local_c8.original.field_2._M_allocated_capacity._1_7_,
                          local_c8.original.field_2._M_local_buf[0]);
            *(undefined8 *)((long)&pbVar16->field_2 + 8) = local_c8.original.field_2._8_8_;
          }
          else {
            (((_Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str> *)&pbVar16->_M_dataplus)
            ->super__Tuple_impl<1UL,_bilingual_str>).super__Head_base<1UL,_bilingual_str,_false>.
            _M_head_impl.original._M_dataplus._M_p = local_c8.original._M_dataplus._M_p;
            (pbVar16->field_2)._M_allocated_capacity =
                 CONCAT71(local_c8.original.field_2._M_allocated_capacity._1_7_,
                          local_c8.original.field_2._M_local_buf[0]);
          }
          pbVar16->_M_string_length = local_c8.original._M_string_length;
          pbVar16[1]._M_dataplus._M_p = (pointer)&pbVar16[1].field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8.translated._M_dataplus._M_p == &local_c8.translated.field_2) {
            pbVar16[1].field_2._M_allocated_capacity =
                 CONCAT44(local_c8.translated.field_2._M_allocated_capacity._4_4_,
                          CONCAT13(local_c8.translated.field_2._M_local_buf[3],
                                   CONCAT12(local_c8.translated.field_2._M_local_buf[2],
                                            CONCAT11(local_c8.translated.field_2._M_local_buf[1],
                                                     local_c8.translated.field_2._M_local_buf[0]))))
            ;
            *(undefined8 *)((long)&pbVar16[1].field_2 + 8) = local_c8.translated.field_2._8_8_;
          }
          else {
            pbVar16[1]._M_dataplus._M_p = local_c8.translated._M_dataplus._M_p;
            pbVar16[1].field_2._M_allocated_capacity =
                 CONCAT44(local_c8.translated.field_2._M_allocated_capacity._4_4_,
                          CONCAT13(local_c8.translated.field_2._M_local_buf[3],
                                   CONCAT12(local_c8.translated.field_2._M_local_buf[2],
                                            CONCAT11(local_c8.translated.field_2._M_local_buf[1],
                                                     local_c8.translated.field_2._M_local_buf[0]))))
            ;
          }
          pbVar16[1]._M_string_length = local_c8.translated._M_string_length;
          goto LAB_00225d64;
        }
        if (((chainman->m_blockman).m_blockfiles_indexed._M_base._M_i & 1U) != 0) {
          pCVar8 = ChainstateManager::ActiveChainstate(chainman);
          bVar6 = Chainstate::LoadGenesisBlock(pCVar8);
          if (!bVar6) {
            local_c8.original._M_dataplus._M_p = (pointer)&local_c8.original.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_c8,"Error initializing block database","");
            if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0)
            {
              local_c8.translated._M_dataplus._M_p = (pointer)&local_c8.translated.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_c8.translated,"Error initializing block database","");
            }
            else {
              local_130.original._M_dataplus._M_p = "Error initializing block database";
              (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                        (&local_c8.translated,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,
                         (char **)&local_130);
            }
            goto LAB_00225cd8;
          }
        }
        if (chainman->m_total_coinstip_cache < 1) {
          __assert_fail("chainman.m_total_coinstip_cache > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/chainstate.cpp"
                        ,0x5f,
                        "ChainstateLoadResult node::CompleteChainstateInitialization(ChainstateManager &, const CacheSizes &, const ChainstateLoadOptions &)"
                       );
        }
        if (chainman->m_total_coinsdb_cache < 1) {
          __assert_fail("chainman.m_total_coinsdb_cache > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/chainstate.cpp"
                        ,0x60,
                        "ChainstateLoadResult node::CompleteChainstateInitialization(ChainstateManager &, const CacheSizes &, const ChainstateLoadOptions &)"
                       );
        }
        ChainstateManager::GetAll
                  ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)&local_130,chainman);
        if (local_130.original._M_dataplus._M_p != (pointer)local_130.original._M_string_length) {
          __x._M_head_impl = (_Impl *)&options->coins_error_cb;
          _Var13._M_p = local_130.original._M_dataplus._M_p;
          __return_storage_ptr__ = (ChainstateLoadResult *)pbVar16;
          do {
            __return_storage_ptr___00 = &local_c8;
            pCVar8 = *(Chainstate **)_Var13._M_p;
            Chainstate::ToString_abi_cxx11_(&__return_storage_ptr___00->original,pCVar8);
            logging_function._M_str = "CompleteChainstateInitialization";
            logging_function._M_len = 0x20;
            source_file._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/chainstate.cpp"
            ;
            source_file._M_len = 0x5c;
            ::LogPrintf_<std::__cxx11::string>
                      (logging_function,source_file,0x6c,
                       IPC|MEMPOOLREJ|PRUNE|RAND|SELECTCOINS|ESTIMATEFEE|RPC|WALLETDB|BENCH|TOR,
                       (Level)__return_storage_ptr___00,in_stack_fffffffffffffe70,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       __return_storage_ptr__);
            pCVar18 = this_02;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8.original._M_dataplus._M_p != &local_c8.original.field_2) {
              operator_delete(local_c8.original._M_dataplus._M_p,
                              CONCAT71(local_c8.original.field_2._M_allocated_capacity._1_7_,
                                       local_c8.original.field_2._M_local_buf[0]) + 1);
            }
            lVar15 = this_02->m_total_coinsdb_cache;
            bVar6 = options->coins_db_in_memory;
            should_wipe = options->wipe_chainstate_db;
            local_c8.original._M_dataplus._M_p = "chainstate";
            std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
                      (&local_f0,(char **)&local_c8,auto_format);
            dVar5 = (double)lVar15 * 0.2;
            uVar9 = (ulong)dVar5;
            leveldb_name.super_path._M_pathname._M_string_length =
                 (size_type)in_stack_fffffffffffffe70;
            leveldb_name.super_path._M_pathname._M_dataplus._M_p =
                 (pointer)__return_storage_ptr___00;
            leveldb_name.super_path._M_pathname.field_2._M_allocated_capacity =
                 (size_type)__return_storage_ptr__;
            leveldb_name.super_path._M_pathname.field_2._8_8_ = pCVar18;
            leveldb_name.super_path._M_cmpts._M_impl._M_t.
            super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
            ._M_t.
            super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
            .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
            _M_head_impl = (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                            )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                              )__x._M_head_impl;
            Chainstate::InitCoinsDB
                      (pCVar8,(long)(dVar5 - 9.223372036854776e+18) & (long)uVar9 >> 0x3f | uVar9,
                       bVar6,should_wipe,leveldb_name);
            std::filesystem::__cxx11::path::~path(&local_f0);
            this_02 = pCVar18;
            if ((options->coins_error_cb).super__Function_base._M_manager != (_Manager_type)0x0) {
              puVar10 = inline_assertion_check<true,std::unique_ptr<CoinsViews,std::default_delete<CoinsViews>>&>
                                  (&pCVar8->m_coins_views,
                                   "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.h"
                                   ,0x285,"CoinsErrorCatcher","m_coins_views");
              pCVar3 = (puVar10->_M_t).
                       super___uniq_ptr_impl<CoinsViews,_std::default_delete<CoinsViews>_>._M_t.
                       super__Tuple_impl<0UL,_CoinsViews_*,_std::default_delete<CoinsViews>_>.
                       super__Head_base<0UL,_CoinsViews_*,_false>._M_head_impl;
              std::function<void_()>::function
                        ((function<void_()> *)&local_150,(function<void_()> *)__x._M_head_impl);
              std::vector<std::function<void()>,std::allocator<std::function<void()>>>::
              emplace_back<std::function<void()>>
                        ((vector<std::function<void()>,std::allocator<std::function<void()>>> *)
                         &(pCVar3->m_catcherview).m_err_callbacks,(function<void_()> *)&local_150);
              this_02 = pCVar18;
              if (local_140 != (code *)0x0) {
                (*local_140)(&local_150,&local_150,__destroy_functor);
                this_02 = pCVar18;
              }
            }
            puVar10 = inline_assertion_check<true,std::unique_ptr<CoinsViews,std::default_delete<CoinsViews>>&>
                                (&pCVar8->m_coins_views,
                                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.h"
                                 ,0x277,"CoinsDB","m_coins_views");
            bVar6 = CCoinsViewDB::NeedsUpgrade
                              (&((puVar10->_M_t).
                                 super___uniq_ptr_impl<CoinsViews,_std::default_delete<CoinsViews>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_CoinsViews_*,_std::default_delete<CoinsViews>_>
                                 .super__Head_base<0UL,_CoinsViews_*,_false>._M_head_impl)->m_dbview
                              );
            if (bVar6) {
              local_c8.original._M_dataplus._M_p = (pointer)&local_c8.original.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_c8,
                         "Unsupported chainstate database format found. Please restart with -reindex-chainstate. This will rebuild the chainstate database."
                         ,"");
              if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0
                 ) {
                local_c8.translated._M_dataplus._M_p = (pointer)&local_c8.translated.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_c8.translated,
                           "Unsupported chainstate database format found. Please restart with -reindex-chainstate. This will rebuild the chainstate database."
                           ,"");
              }
              else {
                local_168.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x8165ee;
                (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                          (&local_c8.translated,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,
                           (char **)&local_168);
              }
              (((_Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str> *)
               &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __return_storage_ptr__)->_M_dataplus)->super__Tuple_impl<1UL,_bilingual_str>).
              super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.original._M_dataplus._M_p =
                   (pointer)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             __return_storage_ptr__)->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8.original._M_dataplus._M_p == &local_c8.original.field_2) {
                (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__)->field_2)._M_allocated_capacity =
                     CONCAT71(local_c8.original.field_2._M_allocated_capacity._1_7_,
                              local_c8.original.field_2._M_local_buf[0]);
                *(undefined8 *)
                 ((long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         __return_storage_ptr__)->field_2 + 8) = local_c8.original.field_2._8_8_;
              }
              else {
                (((_Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str> *)
                 &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__)->_M_dataplus)->super__Tuple_impl<1UL,_bilingual_str>).
                super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.original._M_dataplus._M_p =
                     local_c8.original._M_dataplus._M_p;
                (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__)->field_2)._M_allocated_capacity =
                     CONCAT71(local_c8.original.field_2._M_allocated_capacity._1_7_,
                              local_c8.original.field_2._M_local_buf[0]);
              }
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              __return_storage_ptr__)->_M_string_length = local_c8.original._M_string_length;
              (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)__return_storage_ptr__ + 0x20))->_M_dataplus)._M_p =
                   (pointer)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)__return_storage_ptr__ + 0x20))->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8.translated._M_dataplus._M_p == &local_c8.translated.field_2) {
                (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)__return_storage_ptr__ + 0x20))->field_2)._M_allocated_capacity =
                     CONCAT44(local_c8.translated.field_2._M_allocated_capacity._4_4_,
                              CONCAT13(local_c8.translated.field_2._M_local_buf[3],
                                       CONCAT12(local_c8.translated.field_2._M_local_buf[2],
                                                CONCAT11(local_c8.translated.field_2._M_local_buf[1]
                                                         ,local_c8.translated.field_2._M_local_buf
                                                          [0]))));
                *(undefined8 *)
                 ((long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)__return_storage_ptr__ + 0x20))->field_2 + 8) =
                     local_c8.translated.field_2._8_8_;
              }
              else {
                (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)__return_storage_ptr__ + 0x20))->_M_dataplus)._M_p =
                     local_c8.translated._M_dataplus._M_p;
                (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)__return_storage_ptr__ + 0x20))->field_2)._M_allocated_capacity =
                     CONCAT44(local_c8.translated.field_2._M_allocated_capacity._4_4_,
                              CONCAT13(local_c8.translated.field_2._M_local_buf[3],
                                       CONCAT12(local_c8.translated.field_2._M_local_buf[2],
                                                CONCAT11(local_c8.translated.field_2._M_local_buf[1]
                                                         ,local_c8.translated.field_2._M_local_buf
                                                          [0]))));
              }
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((long)__return_storage_ptr__ + 0x20))->_M_string_length =
                   local_c8.translated._M_string_length;
              *(ChainstateLoadStatus *)
               &(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)__return_storage_ptr__ + 0x40))->_M_dataplus)._M_p = FAILURE_INCOMPATIBLE_DB
              ;
LAB_00225f76:
              local_c8.translated._M_dataplus._M_p = (pointer)&local_c8.translated.field_2;
              local_c8.translated.field_2._M_local_buf[0] = '\0';
              local_c8.translated._M_string_length = 0;
              local_c8.original.field_2._M_local_buf[0] = '\0';
              local_c8.original._M_string_length = 0;
              local_c8.original._M_dataplus._M_p = (pointer)&local_c8.original.field_2;
              pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        __return_storage_ptr__;
              _Var13._M_p = local_130.original._M_dataplus._M_p;
              local_168.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   (pointer)local_130.original.field_2._M_allocated_capacity;
              goto joined_r0x00225fa3;
            }
            bVar6 = Chainstate::ReplayBlocks(pCVar8);
            if (!bVar6) {
              local_c8.original._M_dataplus._M_p = (pointer)&local_c8.original.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_c8,
                         "Unable to replay blocks. You will need to rebuild the database using -reindex-chainstate."
                         ,"");
              if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0
                 ) {
                local_c8.translated._M_dataplus._M_p = (pointer)&local_c8.translated.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_c8.translated,
                           "Unable to replay blocks. You will need to rebuild the database using -reindex-chainstate."
                           ,"");
              }
              else {
                local_168.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x816670;
                (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                          (&local_c8.translated,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,
                           (char **)&local_168);
              }
              (((_Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str> *)
               &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __return_storage_ptr__)->_M_dataplus)->super__Tuple_impl<1UL,_bilingual_str>).
              super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.original._M_dataplus._M_p =
                   (pointer)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             __return_storage_ptr__)->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8.original._M_dataplus._M_p == &local_c8.original.field_2) {
                (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__)->field_2)._M_allocated_capacity =
                     CONCAT71(local_c8.original.field_2._M_allocated_capacity._1_7_,
                              local_c8.original.field_2._M_local_buf[0]);
                *(undefined8 *)
                 ((long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         __return_storage_ptr__)->field_2 + 8) = local_c8.original.field_2._8_8_;
              }
              else {
                (((_Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str> *)
                 &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__)->_M_dataplus)->super__Tuple_impl<1UL,_bilingual_str>).
                super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.original._M_dataplus._M_p =
                     local_c8.original._M_dataplus._M_p;
                (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__)->field_2)._M_allocated_capacity =
                     CONCAT71(local_c8.original.field_2._M_allocated_capacity._1_7_,
                              local_c8.original.field_2._M_local_buf[0]);
              }
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              __return_storage_ptr__)->_M_string_length = local_c8.original._M_string_length;
              (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)__return_storage_ptr__ + 0x20))->_M_dataplus)._M_p =
                   (pointer)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)__return_storage_ptr__ + 0x20))->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8.translated._M_dataplus._M_p == &local_c8.translated.field_2) {
                (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)__return_storage_ptr__ + 0x20))->field_2)._M_allocated_capacity =
                     CONCAT44(local_c8.translated.field_2._M_allocated_capacity._4_4_,
                              CONCAT13(local_c8.translated.field_2._M_local_buf[3],
                                       CONCAT12(local_c8.translated.field_2._M_local_buf[2],
                                                CONCAT11(local_c8.translated.field_2._M_local_buf[1]
                                                         ,local_c8.translated.field_2._M_local_buf
                                                          [0]))));
                *(undefined8 *)
                 ((long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)__return_storage_ptr__ + 0x20))->field_2 + 8) =
                     local_c8.translated.field_2._8_8_;
              }
              else {
                (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)__return_storage_ptr__ + 0x20))->_M_dataplus)._M_p =
                     local_c8.translated._M_dataplus._M_p;
                (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)__return_storage_ptr__ + 0x20))->field_2)._M_allocated_capacity =
                     CONCAT44(local_c8.translated.field_2._M_allocated_capacity._4_4_,
                              CONCAT13(local_c8.translated.field_2._M_local_buf[3],
                                       CONCAT12(local_c8.translated.field_2._M_local_buf[2],
                                                CONCAT11(local_c8.translated.field_2._M_local_buf[1]
                                                         ,local_c8.translated.field_2._M_local_buf
                                                          [0]))));
              }
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((long)__return_storage_ptr__ + 0x20))->_M_string_length =
                   local_c8.translated._M_string_length;
              *(ChainstateLoadStatus *)
               &(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)__return_storage_ptr__ + 0x40))->_M_dataplus)._M_p = FAILURE;
              goto LAB_00225f76;
            }
            dVar5 = (double)this_02->m_total_coinstip_cache * 0.2;
            uVar9 = (ulong)dVar5;
            Chainstate::InitCoinsCache
                      (pCVar8,(long)(dVar5 - 9.223372036854776e+18) & (long)uVar9 >> 0x3f | uVar9);
            pCVar3 = (pCVar8->m_coins_views)._M_t.
                     super___uniq_ptr_impl<CoinsViews,_std::default_delete<CoinsViews>_>._M_t.
                     super__Tuple_impl<0UL,_CoinsViews_*,_std::default_delete<CoinsViews>_>.
                     super__Head_base<0UL,_CoinsViews_*,_false>._M_head_impl;
            if ((pCVar3 == (CoinsViews *)0x0) ||
               ((_Head_base<0UL,_CCoinsViewCache_*,_false>)
                *(_Tuple_impl<0UL,_CCoinsViewCache_*,_std::default_delete<CCoinsViewCache>_> *)
                 &(pCVar3->m_cacheview)._M_t.
                  super___uniq_ptr_impl<CCoinsViewCache,_std::default_delete<CCoinsViewCache>_> ==
                (CCoinsViewCache *)0x0)) {
              __assert_fail("chainstate->CanFlushToDisk()",
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/chainstate.cpp"
                            ,0x86,
                            "ChainstateLoadResult node::CompleteChainstateInitialization(ChainstateManager &, const CacheSizes &, const ChainstateLoadOptions &)"
                           );
            }
            if (options->wipe_chainstate_db == false) {
              pCVar11 = Chainstate::CoinsTip(pCVar8);
              (*(pCVar11->super_CCoinsViewBacked).super_CCoinsView._vptr_CCoinsView[2])
                        (&local_c8,pCVar11);
              puVar12 = std::
                        __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                                  (&local_c8,&local_c8.translated);
              if ((string *)puVar12 != &local_c8.translated) {
                bVar6 = Chainstate::LoadChainTip(pCVar8);
                if (!bVar6) {
                  _(&local_c8,(ConstevalStringLiteral)0x8164c4);
                  (((_Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str> *)
                   &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __return_storage_ptr__)->_M_dataplus)->super__Tuple_impl<1UL,_bilingual_str>).
                  super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.original._M_dataplus._M_p
                       = (pointer)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)__return_storage_ptr__)->field_2;
                  paVar1 = &local_c8.original.field_2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_c8.original._M_dataplus._M_p == paVar1) {
                    (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr__)->field_2)._M_allocated_capacity =
                         CONCAT71(local_c8.original.field_2._M_allocated_capacity._1_7_,
                                  local_c8.original.field_2._M_local_buf[0]);
                    *(undefined8 *)
                     ((long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             __return_storage_ptr__)->field_2 + 8) = local_c8.original.field_2._8_8_
                    ;
                  }
                  else {
                    (((_Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str> *)
                     &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __return_storage_ptr__)->_M_dataplus)->super__Tuple_impl<1UL,_bilingual_str>).
                    super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.original._M_dataplus.
                    _M_p = local_c8.original._M_dataplus._M_p;
                    (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr__)->field_2)._M_allocated_capacity =
                         CONCAT71(local_c8.original.field_2._M_allocated_capacity._1_7_,
                                  local_c8.original.field_2._M_local_buf[0]);
                  }
                  paVar2 = &local_c8.translated.field_2;
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__)->_M_string_length = local_c8.original._M_string_length;
                  local_c8.original._M_string_length = 0;
                  local_c8.original.field_2._M_local_buf[0] = '\0';
                  (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)__return_storage_ptr__ + 0x20))->_M_dataplus)._M_p =
                       (pointer)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)__return_storage_ptr__ + 0x20))->field_2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_c8.translated._M_dataplus._M_p == paVar2) {
                    (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)__return_storage_ptr__ + 0x20))->field_2)._M_allocated_capacity =
                         CONCAT44(local_c8.translated.field_2._M_allocated_capacity._4_4_,
                                  CONCAT13(local_c8.translated.field_2._M_local_buf[3],
                                           CONCAT12(local_c8.translated.field_2._M_local_buf[2],
                                                    CONCAT11(local_c8.translated.field_2.
                                                             _M_local_buf[1],
                                                             local_c8.translated.field_2.
                                                             _M_local_buf[0]))));
                    *(undefined8 *)
                     ((long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)__return_storage_ptr__ + 0x20))->field_2 + 8) =
                         local_c8.translated.field_2._8_8_;
                  }
                  else {
                    (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)__return_storage_ptr__ + 0x20))->_M_dataplus)._M_p =
                         local_c8.translated._M_dataplus._M_p;
                    (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)__return_storage_ptr__ + 0x20))->field_2)._M_allocated_capacity =
                         CONCAT44(local_c8.translated.field_2._M_allocated_capacity._4_4_,
                                  CONCAT13(local_c8.translated.field_2._M_local_buf[3],
                                           CONCAT12(local_c8.translated.field_2._M_local_buf[2],
                                                    CONCAT11(local_c8.translated.field_2.
                                                             _M_local_buf[1],
                                                             local_c8.translated.field_2.
                                                             _M_local_buf[0]))));
                  }
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((long)__return_storage_ptr__ + 0x20))->_M_string_length =
                       local_c8.translated._M_string_length;
                  local_c8.translated._M_string_length = 0;
                  local_c8.translated.field_2._M_local_buf[0] = '\0';
                  *(ChainstateLoadStatus *)
                   &(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)__return_storage_ptr__ + 0x40))->_M_dataplus)._M_p = FAILURE;
                  local_c8.original._M_dataplus._M_p = (pointer)paVar1;
                  local_c8.translated._M_dataplus._M_p = (pointer)paVar2;
                  bilingual_str::~bilingual_str(&local_c8);
                  pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __return_storage_ptr__;
                  _Var13._M_p = local_130.original._M_dataplus._M_p;
                  local_168.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage =
                       (pointer)local_130.original.field_2._M_allocated_capacity;
                  goto joined_r0x00225fa3;
                }
                ppCVar4 = (pCVar8->m_chain).vChain.
                          super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                          super__Vector_impl_data._M_finish;
                if ((ppCVar4 ==
                     (pCVar8->m_chain).vChain.
                     super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                     super__Vector_impl_data._M_start) || (ppCVar4[-1] == (CBlockIndex *)0x0)) {
                  __assert_fail("chainstate->m_chain.Tip() != nullptr",
                                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/chainstate.cpp"
                                ,0x8d,
                                "ChainstateLoadResult node::CompleteChainstateInitialization(ChainstateManager &, const CacheSizes &, const ChainstateLoadOptions &)"
                               );
                }
              }
            }
            _Var13._M_p = _Var13._M_p + 8;
            pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __return_storage_ptr__;
          } while (_Var13._M_p != (pointer)local_130.original._M_string_length);
        }
        if (local_130.original._M_dataplus._M_p != (char *)0x0) {
          operator_delete(local_130.original._M_dataplus._M_p,
                          local_130.original.field_2._M_allocated_capacity -
                          (long)local_130.original._M_dataplus._M_p);
        }
        if (options->wipe_block_tree_db == false) {
          ChainstateManager::GetAll(&local_168,this_02);
          lVar15 = (long)local_168.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_168.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 5;
          ppCVar14 = local_168.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          if (0 < lVar15) {
            lVar15 = lVar15 + 1;
            ppCVar14 = local_168.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                       _M_impl.super__Vector_impl_data._M_start + 2;
            do {
              ppCVar17 = ppCVar14;
              bVar6 = Chainstate::NeedsRedownload(ppCVar17[-2]);
              if (bVar6) {
                ppCVar17 = ppCVar17 + -2;
                goto LAB_00226010;
              }
              bVar6 = Chainstate::NeedsRedownload(ppCVar17[-1]);
              if (bVar6) {
                ppCVar17 = ppCVar17 + -1;
                goto LAB_00226010;
              }
              bVar6 = Chainstate::NeedsRedownload(*ppCVar17);
              if (bVar6) goto LAB_00226010;
              bVar6 = Chainstate::NeedsRedownload(ppCVar17[1]);
              if (bVar6) {
                ppCVar17 = ppCVar17 + 1;
                goto LAB_00226010;
              }
              lVar15 = lVar15 + -1;
              ppCVar14 = ppCVar17 + 4;
            } while (1 < lVar15);
            ppCVar14 = ppCVar17 + 2;
          }
          lVar15 = (long)local_168.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)ppCVar14 >> 3;
          if (lVar15 == 1) {
LAB_00225af6:
            bVar6 = Chainstate::NeedsRedownload(*ppCVar14);
            ppCVar17 = ppCVar14;
            if (!bVar6) {
              ppCVar17 = local_168.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
            }
          }
          else if (lVar15 == 2) {
LAB_00225ae5:
            bVar6 = Chainstate::NeedsRedownload(*ppCVar14);
            ppCVar17 = ppCVar14;
            if (!bVar6) {
              ppCVar14 = ppCVar14 + 1;
              goto LAB_00225af6;
            }
          }
          else {
            ppCVar17 = local_168.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            if ((lVar15 == 3) &&
               (bVar6 = Chainstate::NeedsRedownload(*ppCVar14), ppCVar17 = ppCVar14, !bVar6)) {
              ppCVar14 = ppCVar14 + 1;
              goto LAB_00225ae5;
            }
          }
LAB_00226010:
          if (ppCVar17 !=
              local_168.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            _(&local_130,(ConstevalStringLiteral)0x81670c);
            tinyformat::format<int>
                      (&local_c8,&local_130,
                       &(((this_02->m_options).chainparams)->consensus).SegwitHeight);
            (((_Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str> *)
             &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              __return_storage_ptr__)->_M_dataplus)->super__Tuple_impl<1UL,_bilingual_str>).
            super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.original._M_dataplus._M_p =
                 (pointer)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           __return_storage_ptr__)->field_2;
            paVar1 = &local_c8.original.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8.original._M_dataplus._M_p == paVar1) {
              (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__)->field_2)._M_allocated_capacity =
                   CONCAT71(local_c8.original.field_2._M_allocated_capacity._1_7_,
                            local_c8.original.field_2._M_local_buf[0]);
              *(undefined8 *)
               ((long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       __return_storage_ptr__)->field_2 + 8) = local_c8.original.field_2._8_8_;
            }
            else {
              (((_Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str> *)
               &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __return_storage_ptr__)->_M_dataplus)->super__Tuple_impl<1UL,_bilingual_str>).
              super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.original._M_dataplus._M_p =
                   local_c8.original._M_dataplus._M_p;
              (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__)->field_2)._M_allocated_capacity =
                   CONCAT71(local_c8.original.field_2._M_allocated_capacity._1_7_,
                            local_c8.original.field_2._M_local_buf[0]);
            }
            paVar2 = &local_c8.translated.field_2;
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __return_storage_ptr__)->_M_string_length = local_c8.original._M_string_length;
            local_c8.original._M_string_length = 0;
            local_c8.original.field_2._M_local_buf[0] = '\0';
            (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)__return_storage_ptr__ + 0x20))->_M_dataplus)._M_p =
                 (pointer)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)__return_storage_ptr__ + 0x20))->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8.translated._M_dataplus._M_p == paVar2) {
              (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)__return_storage_ptr__ + 0x20))->field_2)._M_allocated_capacity =
                   CONCAT44(local_c8.translated.field_2._M_allocated_capacity._4_4_,
                            CONCAT13(local_c8.translated.field_2._M_local_buf[3],
                                     CONCAT12(local_c8.translated.field_2._M_local_buf[2],
                                              CONCAT11(local_c8.translated.field_2._M_local_buf[1],
                                                       local_c8.translated.field_2._M_local_buf[0]))
                                    ));
              *(undefined8 *)
               ((long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)__return_storage_ptr__ + 0x20))->field_2 + 8) =
                   local_c8.translated.field_2._8_8_;
            }
            else {
              (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)__return_storage_ptr__ + 0x20))->_M_dataplus)._M_p =
                   local_c8.translated._M_dataplus._M_p;
              (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)__return_storage_ptr__ + 0x20))->field_2)._M_allocated_capacity =
                   CONCAT44(local_c8.translated.field_2._M_allocated_capacity._4_4_,
                            CONCAT13(local_c8.translated.field_2._M_local_buf[3],
                                     CONCAT12(local_c8.translated.field_2._M_local_buf[2],
                                              CONCAT11(local_c8.translated.field_2._M_local_buf[1],
                                                       local_c8.translated.field_2._M_local_buf[0]))
                                    ));
            }
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            ((long)__return_storage_ptr__ + 0x20))->_M_string_length =
                 local_c8.translated._M_string_length;
            local_c8.translated._M_string_length = 0;
            local_c8.translated.field_2._M_local_buf[0] = '\0';
            *(ChainstateLoadStatus *)
             &(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)__return_storage_ptr__ + 0x40))->_M_dataplus)._M_p = FAILURE;
            local_c8.original._M_dataplus._M_p = (pointer)paVar1;
            local_c8.translated._M_dataplus._M_p = (pointer)paVar2;
            bilingual_str::~bilingual_str(&local_c8);
            bilingual_str::~bilingual_str(&local_130);
            pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __return_storage_ptr__;
            _Var13._M_p = (pointer)local_168.
                                   super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                                   _M_impl.super__Vector_impl_data._M_start;
joined_r0x00225fa3:
            if ((pointer)_Var13._M_p != (pointer)0x0) {
              operator_delete(_Var13._M_p,
                              (long)local_168.
                                    super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)_Var13._M_p);
            }
            goto LAB_00225d9d;
          }
          if (local_168.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_168.
                            super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_168.
                                  super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_168.
                                  super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
        }
        ChainstateManager::MaybeRebalanceCaches(this_02);
        local_c8.original._M_dataplus._M_p = (pointer)&local_c8.original.field_2;
        local_c8.original._M_string_length = 0;
        local_c8.original.field_2._M_local_buf[0] = '\0';
        local_c8.translated._M_dataplus._M_p = (pointer)&local_c8.translated.field_2;
        local_c8.translated._M_string_length = 0;
        local_c8.translated.field_2._M_local_buf[0] = '\0';
        std::_Head_base<1UL,_bilingual_str,_false>::_Head_base
                  ((_Head_base<1UL,_bilingual_str,_false> *)__return_storage_ptr__,&local_c8);
        *(ChainstateLoadStatus *)
         &(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)__return_storage_ptr__ + 0x40))->_M_dataplus)._M_p = SUCCESS;
        goto LAB_002253c6;
      }
      paVar1 = &local_c8.original.field_2;
      local_c8.original._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c8,
                 "Incorrect or no genesis block found. Wrong datadir for network?","");
      if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
        local_c8.translated._M_dataplus._M_p = (pointer)&local_c8.translated.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c8.translated,
                   "Incorrect or no genesis block found. Wrong datadir for network?","");
      }
      else {
        local_130.original._M_dataplus._M_p =
             "Incorrect or no genesis block found. Wrong datadir for network?";
        (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                  (&local_c8.translated,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,
                   (char **)&local_130);
      }
      (((_Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str> *)&pbVar16->_M_dataplus)->
      super__Tuple_impl<1UL,_bilingual_str>).super__Head_base<1UL,_bilingual_str,_false>.
      _M_head_impl.original._M_dataplus._M_p = (pointer)&pbVar16->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.original._M_dataplus._M_p == paVar1) {
        (pbVar16->field_2)._M_allocated_capacity =
             CONCAT71(local_c8.original.field_2._M_allocated_capacity._1_7_,
                      local_c8.original.field_2._M_local_buf[0]);
        *(undefined8 *)((long)&pbVar16->field_2 + 8) = local_c8.original.field_2._8_8_;
      }
      else {
        (((_Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str> *)&pbVar16->_M_dataplus)->
        super__Tuple_impl<1UL,_bilingual_str>).super__Head_base<1UL,_bilingual_str,_false>.
        _M_head_impl.original._M_dataplus._M_p = local_c8.original._M_dataplus._M_p;
        (pbVar16->field_2)._M_allocated_capacity =
             CONCAT71(local_c8.original.field_2._M_allocated_capacity._1_7_,
                      local_c8.original.field_2._M_local_buf[0]);
      }
      pbVar16->_M_string_length = local_c8.original._M_string_length;
      pbVar16[1]._M_dataplus._M_p = (pointer)&pbVar16[1].field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.translated._M_dataplus._M_p == &local_c8.translated.field_2) {
        pbVar16[1].field_2._M_allocated_capacity =
             CONCAT44(local_c8.translated.field_2._M_allocated_capacity._4_4_,
                      CONCAT13(local_c8.translated.field_2._M_local_buf[3],
                               CONCAT12(local_c8.translated.field_2._M_local_buf[2],
                                        CONCAT11(local_c8.translated.field_2._M_local_buf[1],
                                                 local_c8.translated.field_2._M_local_buf[0]))));
        *(undefined8 *)((long)&pbVar16[1].field_2 + 8) = local_c8.translated.field_2._8_8_;
      }
      else {
        pbVar16[1]._M_dataplus._M_p = local_c8.translated._M_dataplus._M_p;
        pbVar16[1].field_2._M_allocated_capacity =
             CONCAT44(local_c8.translated.field_2._M_allocated_capacity._4_4_,
                      CONCAT13(local_c8.translated.field_2._M_local_buf[3],
                               CONCAT12(local_c8.translated.field_2._M_local_buf[2],
                                        CONCAT11(local_c8.translated.field_2._M_local_buf[1],
                                                 local_c8.translated.field_2._M_local_buf[0]))));
      }
      pbVar16[1]._M_string_length = local_c8.translated._M_string_length;
      *(ChainstateLoadStatus *)&pbVar16[2]._M_dataplus._M_p = FAILURE_INCOMPATIBLE_DB;
    }
    else {
      __return_storage_ptr__ = (ChainstateLoadResult *)pbVar16;
      bVar6 = util::SignalInterrupt::operator_cast_to_bool(chainman->m_interrupt);
      paVar1 = &local_c8.original.field_2;
      local_c8.original._M_dataplus._M_p = (pointer)paVar1;
      if (bVar6) {
        local_c8.original._M_string_length = 0;
        local_c8.original.field_2._M_local_buf[0] = '\0';
        local_c8.translated._M_dataplus._M_p = (pointer)&local_c8.translated.field_2;
        local_c8.translated._M_string_length = 0;
        local_c8.translated.field_2._M_local_buf[0] = '\0';
        pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__;
        std::_Head_base<1UL,_bilingual_str,_false>::_Head_base
                  ((_Head_base<1UL,_bilingual_str,_false> *)__return_storage_ptr__,&local_c8);
        goto LAB_002253be;
      }
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c8,"Error loading block database","");
      paVar2 = &local_c8.translated.field_2;
      if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
        local_c8.translated._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c8.translated,"Error loading block database","");
        pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__;
      }
      else {
        local_130.original._M_dataplus._M_p = "Error loading block database";
        (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                  (&local_c8.translated,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,
                   (char **)&local_130);
        pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__;
      }
      (((_Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str> *)&pbVar16->_M_dataplus)->
      super__Tuple_impl<1UL,_bilingual_str>).super__Head_base<1UL,_bilingual_str,_false>.
      _M_head_impl.original._M_dataplus._M_p = (pointer)&pbVar16->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.original._M_dataplus._M_p == paVar1) {
        (pbVar16->field_2)._M_allocated_capacity =
             CONCAT71(local_c8.original.field_2._M_allocated_capacity._1_7_,
                      local_c8.original.field_2._M_local_buf[0]);
        *(undefined8 *)((long)&pbVar16->field_2 + 8) = local_c8.original.field_2._8_8_;
      }
      else {
        (((_Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str> *)&pbVar16->_M_dataplus)->
        super__Tuple_impl<1UL,_bilingual_str>).super__Head_base<1UL,_bilingual_str,_false>.
        _M_head_impl.original._M_dataplus._M_p = local_c8.original._M_dataplus._M_p;
        (pbVar16->field_2)._M_allocated_capacity =
             CONCAT71(local_c8.original.field_2._M_allocated_capacity._1_7_,
                      local_c8.original.field_2._M_local_buf[0]);
      }
      pbVar16->_M_string_length = local_c8.original._M_string_length;
      pbVar16[1]._M_dataplus._M_p = (pointer)&pbVar16[1].field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.translated._M_dataplus._M_p == paVar2) {
        pbVar16[1].field_2._M_allocated_capacity =
             CONCAT44(local_c8.translated.field_2._M_allocated_capacity._4_4_,
                      CONCAT13(local_c8.translated.field_2._M_local_buf[3],
                               CONCAT12(local_c8.translated.field_2._M_local_buf[2],
                                        CONCAT11(local_c8.translated.field_2._M_local_buf[1],
                                                 local_c8.translated.field_2._M_local_buf[0]))));
        *(undefined8 *)((long)&pbVar16[1].field_2 + 8) = local_c8.translated.field_2._8_8_;
      }
      else {
        pbVar16[1]._M_dataplus._M_p = local_c8.translated._M_dataplus._M_p;
        pbVar16[1].field_2._M_allocated_capacity =
             CONCAT44(local_c8.translated.field_2._M_allocated_capacity._4_4_,
                      CONCAT13(local_c8.translated.field_2._M_local_buf[3],
                               CONCAT12(local_c8.translated.field_2._M_local_buf[2],
                                        CONCAT11(local_c8.translated.field_2._M_local_buf[1],
                                                 local_c8.translated.field_2._M_local_buf[0]))));
      }
      pbVar16[1]._M_string_length = local_c8.translated._M_string_length;
LAB_00225d64:
      *(ChainstateLoadStatus *)&pbVar16[2]._M_dataplus._M_p = FAILURE;
    }
    local_c8.translated._M_dataplus._M_p = (pointer)&local_c8.translated.field_2;
    local_c8.translated.field_2._M_local_buf[0] = '\0';
    local_c8.translated._M_string_length = 0;
    local_c8.original.field_2._M_local_buf[0] = '\0';
    local_c8.original._M_string_length = 0;
    local_c8.original._M_dataplus._M_p = (pointer)&local_c8.original.field_2;
  }
LAB_00225d9d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (ChainstateLoadResult *)pbVar16;
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(::cs_main)
{
    auto& pblocktree{chainman.m_blockman.m_block_tree_db};
    // new BlockTreeDB tries to delete the existing file, which
    // fails if it's still open from the previous loop. Close it first:
    pblocktree.reset();
    pblocktree = std::make_unique<BlockTreeDB>(DBParams{
        .path = chainman.m_options.datadir / "blocks" / "index",
        .cache_bytes = static_cast<size_t>(cache_sizes.block_tree_db),
        .memory_only = options.block_tree_db_in_memory,
        .wipe_data = options.wipe_block_tree_db,
        .options = chainman.m_options.block_tree_db});

    if (options.wipe_block_tree_db) {
        pblocktree->WriteReindexing(true);
        chainman.m_blockman.m_blockfiles_indexed = false;
        //If we're reindexing in prune mode, wipe away unusable block files and all undo data files
        if (options.prune) {
            chainman.m_blockman.CleanupBlockRevFiles();
        }
    }

    if (chainman.m_interrupt) return {ChainstateLoadStatus::INTERRUPTED, {}};

    // LoadBlockIndex will load m_have_pruned if we've ever removed a
    // block file from disk.
    // Note that it also sets m_blockfiles_indexed based on the disk flag!
    if (!chainman.LoadBlockIndex()) {
        if (chainman.m_interrupt) return {ChainstateLoadStatus::INTERRUPTED, {}};
        return {ChainstateLoadStatus::FAILURE, _("Error loading block database")};
    }

    if (!chainman.BlockIndex().empty() &&
            !chainman.m_blockman.LookupBlockIndex(chainman.GetConsensus().hashGenesisBlock)) {
        // If the loaded chain has a wrong genesis, bail out immediately
        // (we're likely using a testnet datadir, or the other way around).
        return {ChainstateLoadStatus::FAILURE_INCOMPATIBLE_DB, _("Incorrect or no genesis block found. Wrong datadir for network?")};
    }

    // Check for changed -prune state.  What we are concerned about is a user who has pruned blocks
    // in the past, but is now trying to run unpruned.
    if (chainman.m_blockman.m_have_pruned && !options.prune) {
        return {ChainstateLoadStatus::FAILURE, _("You need to rebuild the database using -reindex to go back to unpruned mode.  This will redownload the entire blockchain")};
    }

    // At this point blocktree args are consistent with what's on disk.
    // If we're not mid-reindex (based on disk + args), add a genesis block on disk
    // (otherwise we use the one already on disk).
    // This is called again in ImportBlocks after the reindex completes.
    if (chainman.m_blockman.m_blockfiles_indexed && !chainman.ActiveChainstate().LoadGenesisBlock()) {
        return {ChainstateLoadStatus::FAILURE, _("Error initializing block database")};
    }

    auto is_coinsview_empty = [&](Chainstate* chainstate) EXCLUSIVE_LOCKS_REQUIRED(::cs_main) {
        return options.wipe_chainstate_db || chainstate->CoinsTip().GetBestBlock().IsNull();
    };

    assert(chainman.m_total_coinstip_cache > 0);
    assert(chainman.m_total_coinsdb_cache > 0);

    // Conservative value which is arbitrarily chosen, as it will ultimately be changed
    // by a call to `chainman.MaybeRebalanceCaches()`. We just need to make sure
    // that the sum of the two caches (40%) does not exceed the allowable amount
    // during this temporary initialization state.
    double init_cache_fraction = 0.2;

    // At this point we're either in reindex or we've loaded a useful
    // block tree into BlockIndex()!

    for (Chainstate* chainstate : chainman.GetAll()) {
        LogPrintf("Initializing chainstate %s\n", chainstate->ToString());

        chainstate->InitCoinsDB(
            /*cache_size_bytes=*/chainman.m_total_coinsdb_cache * init_cache_fraction,
            /*in_memory=*/options.coins_db_in_memory,
            /*should_wipe=*/options.wipe_chainstate_db);

        if (options.coins_error_cb) {
            chainstate->CoinsErrorCatcher().AddReadErrCallback(options.coins_error_cb);
        }

        // Refuse to load unsupported database format.
        // This is a no-op if we cleared the coinsviewdb with -reindex or -reindex-chainstate
        if (chainstate->CoinsDB().NeedsUpgrade()) {
            return {ChainstateLoadStatus::FAILURE_INCOMPATIBLE_DB, _("Unsupported chainstate database format found. "
                                                                     "Please restart with -reindex-chainstate. This will "
                                                                     "rebuild the chainstate database.")};
        }

        // ReplayBlocks is a no-op if we cleared the coinsviewdb with -reindex or -reindex-chainstate
        if (!chainstate->ReplayBlocks()) {
            return {ChainstateLoadStatus::FAILURE, _("Unable to replay blocks. You will need to rebuild the database using -reindex-chainstate.")};
        }

        // The on-disk coinsdb is now in a good state, create the cache
        chainstate->InitCoinsCache(chainman.m_total_coinstip_cache * init_cache_fraction);
        assert(chainstate->CanFlushToDisk());

        if (!is_coinsview_empty(chainstate)) {
            // LoadChainTip initializes the chain based on CoinsTip()'s best block
            if (!chainstate->LoadChainTip()) {
                return {ChainstateLoadStatus::FAILURE, _("Error initializing block database")};
            }
            assert(chainstate->m_chain.Tip() != nullptr);
        }
    }

    if (!options.wipe_block_tree_db) {
        auto chainstates{chainman.GetAll()};
        if (std::any_of(chainstates.begin(), chainstates.end(),
                        [](const Chainstate* cs) EXCLUSIVE_LOCKS_REQUIRED(cs_main) { return cs->NeedsRedownload(); })) {
            return {ChainstateLoadStatus::FAILURE, strprintf(_("Witness data for blocks after height %d requires validation. Please restart with -reindex."),
                                                             chainman.GetConsensus().SegwitHeight)};
        };
    }

    // Now that chainstates are loaded and we're able to flush to
    // disk, rebalance the coins caches to desired levels based
    // on the condition of each chainstate.
    chainman.MaybeRebalanceCaches();

    return {ChainstateLoadStatus::SUCCESS, {}};
}